

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O3

int tbx_parse1(tbx_conf_t *conf,int len,char *line,tbx_intv_t *intv)

{
  char *pcVar1;
  char cVar2;
  short sVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  char *s;
  char *t;
  char *local_68;
  tbx_intv_t *local_60;
  ulong local_58;
  tbx_conf_t *local_50;
  char **local_48;
  __int32_t **local_40;
  char *local_38;
  
  intv->ss = (char *)0x0;
  intv->se = (char *)0x0;
  *(undefined4 *)&intv->beg = 0xffffffff;
  *(undefined4 *)((long)&intv->beg + 4) = 0xffffffff;
  *(undefined4 *)&intv->end = 0xffffffff;
  *(undefined4 *)((long)&intv->end + 4) = 0xffffffff;
  iVar11 = -1;
  if (-1 < len) {
    local_48 = &intv->ss;
    uVar9 = (ulong)(len + 1);
    iVar10 = 1;
    uVar12 = 0;
    iVar11 = 0;
    local_60 = intv;
    local_58 = uVar9;
    local_50 = conf;
    do {
      cVar2 = line[uVar12];
      if ((cVar2 == '\0') || (cVar2 == '\t')) {
        pcVar1 = line + uVar12;
        if (iVar10 == conf->sc) {
          intv->ss = line + iVar11;
          intv->se = pcVar1;
        }
        else if (iVar10 == conf->bc) {
          lVar4 = strtol(line + iVar11,&local_68,0);
          intv->end = lVar4;
          intv->beg = lVar4;
          if (local_68 == line + iVar11) goto LAB_001170a0;
          if ((local_50->preset & 0x10000) == 0) {
            local_60->beg = lVar4 + -1;
            lVar5 = lVar4 + -1;
            lVar6 = lVar4;
          }
          else {
            lVar6 = lVar4 + 1;
            local_60->end = lVar6;
            lVar5 = lVar4;
          }
          if (lVar5 < 0) {
            local_60->beg = 0;
          }
          intv = local_60;
          uVar9 = local_58;
          conf = local_50;
          if (lVar6 < 1) {
            local_60->end = 1;
          }
        }
        else {
          sVar3 = (short)conf->preset;
          if (sVar3 == 2) {
            if (iVar10 == 8) {
              *pcVar1 = '\0';
              pcVar7 = line + iVar11;
              local_68 = strstr(pcVar7,"END=");
              if (local_68 == pcVar7) {
                local_68 = local_68 + 4;
LAB_0011703b:
                lVar4 = strtol(local_68,&local_68,0);
                local_60->end = lVar4;
              }
              else if ((local_68 != (char *)0x0) &&
                      (local_68 = strstr(pcVar7,";END="), local_68 != (char *)0x0)) {
                local_68 = local_68 + 5;
                goto LAB_0011703b;
              }
              *pcVar1 = cVar2;
              intv = local_60;
              uVar9 = local_58;
              conf = local_50;
            }
            else if ((iVar10 == 4) && ((long)iVar11 < (long)uVar12)) {
              intv->end = (long)((int)uVar12 - iVar11) + intv->beg;
            }
          }
          else if (sVar3 == 1) {
            if (iVar10 == 6) {
              pcVar7 = line + iVar11;
              iVar8 = 0;
              if ((long)iVar11 < (long)uVar12) {
                iVar8 = 0;
                local_40 = __ctype_toupper_loc();
                do {
                  lVar4 = strtol(pcVar7,&local_38,10);
                  if (((*local_40)[*local_38] - 0x44U < 0xb) &&
                     ((0x601U >> ((*local_40)[*local_38] - 0x44U & 0x1f) & 1) != 0)) {
                    iVar8 = iVar8 + (int)lVar4;
                  }
                  pcVar7 = local_38 + 1;
                } while (pcVar7 < pcVar1);
              }
              local_60->end = (long)(int)(iVar8 + (uint)(iVar8 == 0)) + local_60->beg;
              intv = local_60;
              uVar9 = local_58;
              conf = local_50;
              local_68 = pcVar7;
            }
          }
          else if ((sVar3 == 0) && (iVar10 == conf->ec)) {
            lVar4 = strtol(line + iVar11,&local_68,0);
            local_60->end = lVar4;
            intv = local_60;
            uVar9 = local_58;
            conf = local_50;
            if (local_68 == line + iVar11) goto LAB_001170a0;
          }
        }
        iVar11 = (int)uVar12 + 1;
        iVar10 = iVar10 + 1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar9);
    if (*local_48 == (char *)0x0) {
LAB_001170a0:
      iVar11 = -1;
    }
    else {
      iVar11 = -1;
      if ((intv->se != (char *)0x0) && (-1 < intv->beg)) {
        iVar11 = (int)(intv->end >> 0x3f);
      }
    }
  }
  return iVar11;
}

Assistant:

int tbx_parse1(const tbx_conf_t *conf, int len, char *line, tbx_intv_t *intv)
{
    int i, b = 0, id = 1, ncols = 0;
    char *s;
    intv->ss = intv->se = 0; intv->beg = intv->end = -1;
    for (i = 0; i <= len; ++i) {
        if (line[i] == '\t' || line[i] == 0) {
            ++ncols;
            if (id == conf->sc) {
                intv->ss = line + b; intv->se = line + i;
            } else if (id == conf->bc) {
                // here ->beg is 0-based.
                intv->beg = intv->end = strtol(line + b, &s, 0);
                if ( s==line+b ) return -1; // expected int
                if (!(conf->preset&TBX_UCSC)) --intv->beg;
                else ++intv->end;
                if (intv->beg < 0) intv->beg = 0;
                if (intv->end < 1) intv->end = 1;
            } else {
                if ((conf->preset&0xffff) == TBX_GENERIC) {
                    if (id == conf->ec)
                    {
                        intv->end = strtol(line + b, &s, 0);
                        if ( s==line+b ) return -1; // expected int
                    }
                } else if ((conf->preset&0xffff) == TBX_SAM) {
                    if (id == 6) { // CIGAR
                        int l = 0, op;
                        char *t;
                        for (s = line + b; s < line + i;) {
                            long x = strtol(s, &t, 10);
                            op = toupper(*t);
                            if (op == 'M' || op == 'D' || op == 'N') l += x;
                            s = t + 1;
                        }
                        if (l == 0) l = 1;
                        intv->end = intv->beg + l;
                    }
                } else if ((conf->preset&0xffff) == TBX_VCF) {
                    if (id == 4) {
                        if (b < i) intv->end = intv->beg + (i - b);
                    } else if (id == 8) { // look for "END="
                        int c = line[i];
                        line[i] = 0;
                        s = strstr(line + b, "END=");
                        if (s == line + b) s += 4;
                        else if (s) {
                            s = strstr(line + b, ";END=");
                            if (s) s += 5;
                        }
                        if (s) intv->end = strtol(s, &s, 0);
                        line[i] = c;
                    }
                }
            }
            b = i + 1;
            ++id;
        }
    }
    if (intv->ss == 0 || intv->se == 0 || intv->beg < 0 || intv->end < 0) return -1;
    return 0;
}